

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  Ref<embree::Geometry> *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  int iVar25;
  int iVar26;
  undefined4 uVar27;
  undefined1 *puVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  float fVar39;
  uint uVar40;
  float fVar41;
  float fVar56;
  float fVar60;
  vint4 bi;
  uint uVar57;
  uint uVar61;
  float fVar63;
  uint uVar64;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar58;
  float fVar59;
  float fVar62;
  float fVar65;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar66;
  int iVar68;
  float fVar77;
  int iVar79;
  float fVar80;
  int iVar82;
  vint4 bi_1;
  float fVar67;
  float fVar78;
  float fVar81;
  float fVar83;
  float fVar84;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar85;
  float fVar86;
  uint uVar87;
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar97;
  vint4 ai;
  uint uVar94;
  float fVar95;
  float fVar96;
  uint uVar98;
  float fVar99;
  float fVar100;
  uint uVar101;
  float fVar102;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar103;
  float fVar104;
  float fVar108;
  float fVar110;
  vint4 ai_1;
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int iVar114;
  int iVar115;
  int iVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar124;
  float fVar127;
  undefined1 auVar120 [16];
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar133;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  float fVar151;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  vbool<4> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  long local_11b8;
  undefined8 local_11a8;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1138;
  undefined8 uStack_1130;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  float local_10b8 [4];
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  pauVar35 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar26 = (tray->tnear).field_0.i[k];
  iVar85 = (tray->tfar).field_0.i[k];
  puVar28 = mm_lookupmask_ps;
  local_fa8 = mm_lookupmask_ps._0_8_;
  uStack_fa0 = mm_lookupmask_ps._8_8_;
  local_fb8 = mm_lookupmask_ps._240_8_;
  uStack_fb0 = mm_lookupmask_ps._248_8_;
  local_f98 = iVar26;
  iStack_f94 = iVar26;
  iStack_f90 = iVar26;
  iStack_f8c = iVar26;
  iVar82 = iVar85;
  iVar79 = iVar85;
  iVar68 = iVar85;
  iVar116 = iVar26;
  iVar115 = iVar26;
  iVar114 = iVar26;
LAB_00269452:
  do {
    pauVar3 = pauVar35 + -1;
    pauVar35 = pauVar35 + -1;
    if (*(float *)((long)*pauVar3 + 8) < *(float *)(ray + k * 4 + 0x80) ||
        *(float *)((long)*pauVar3 + 8) == *(float *)(ray + k * 4 + 0x80)) {
      uVar38 = *(ulong *)*pauVar35;
      while ((uVar38 & 8) == 0) {
        pfVar1 = (float *)(uVar38 + 0x20 + uVar31);
        fVar39 = (*pfVar1 - fVar4) * fVar7;
        fVar56 = (pfVar1[1] - fVar4) * fVar7;
        fVar60 = (pfVar1[2] - fVar4) * fVar7;
        fVar63 = (pfVar1[3] - fVar4) * fVar7;
        pfVar1 = (float *)(uVar38 + 0x20 + uVar33);
        fVar86 = (*pfVar1 - fVar5) * fVar8;
        fVar93 = (pfVar1[1] - fVar5) * fVar8;
        fVar97 = (pfVar1[2] - fVar5) * fVar8;
        fVar100 = (pfVar1[3] - fVar5) * fVar8;
        uVar87 = (uint)((int)fVar86 < (int)fVar39) * (int)fVar39 |
                 (uint)((int)fVar86 >= (int)fVar39) * (int)fVar86;
        uVar94 = (uint)((int)fVar93 < (int)fVar56) * (int)fVar56 |
                 (uint)((int)fVar93 >= (int)fVar56) * (int)fVar93;
        uVar98 = (uint)((int)fVar97 < (int)fVar60) * (int)fVar60 |
                 (uint)((int)fVar97 >= (int)fVar60) * (int)fVar97;
        uVar101 = (uint)((int)fVar100 < (int)fVar63) * (int)fVar63 |
                  (uint)((int)fVar100 >= (int)fVar63) * (int)fVar100;
        pfVar1 = (float *)(uVar38 + 0x20 + uVar34);
        fVar39 = (*pfVar1 - fVar6) * fVar9;
        fVar56 = (pfVar1[1] - fVar6) * fVar9;
        fVar60 = (pfVar1[2] - fVar6) * fVar9;
        fVar63 = (pfVar1[3] - fVar6) * fVar9;
        uVar40 = (uint)((int)fVar39 < iVar114) * iVar114 |
                 (uint)((int)fVar39 >= iVar114) * (int)fVar39;
        uVar57 = (uint)((int)fVar56 < iVar115) * iVar115 |
                 (uint)((int)fVar56 >= iVar115) * (int)fVar56;
        uVar61 = (uint)((int)fVar60 < iVar116) * iVar116 |
                 (uint)((int)fVar60 >= iVar116) * (int)fVar60;
        uVar64 = (uint)((int)fVar63 < iVar26) * iVar26 | (uint)((int)fVar63 >= iVar26) * (int)fVar63
        ;
        local_10b8[0] =
             (float)(((int)uVar40 < (int)uVar87) * uVar87 | ((int)uVar40 >= (int)uVar87) * uVar40);
        local_10b8[1] =
             (float)(((int)uVar57 < (int)uVar94) * uVar94 | ((int)uVar57 >= (int)uVar94) * uVar57);
        local_10b8[2] =
             (float)(((int)uVar61 < (int)uVar98) * uVar98 | ((int)uVar61 >= (int)uVar98) * uVar61);
        local_10b8[3] =
             (float)(((int)uVar64 < (int)uVar101) * uVar101 | ((int)uVar64 >= (int)uVar101) * uVar64
                    );
        pfVar1 = (float *)(uVar38 + 0x20 + (uVar31 ^ 0x10));
        fVar39 = (*pfVar1 - fVar4) * fVar7;
        fVar56 = (pfVar1[1] - fVar4) * fVar7;
        fVar60 = (pfVar1[2] - fVar4) * fVar7;
        fVar63 = (pfVar1[3] - fVar4) * fVar7;
        pfVar1 = (float *)(uVar38 + 0x20 + (uVar33 ^ 0x10));
        fVar86 = (*pfVar1 - fVar5) * fVar8;
        fVar93 = (pfVar1[1] - fVar5) * fVar8;
        fVar97 = (pfVar1[2] - fVar5) * fVar8;
        fVar100 = (pfVar1[3] - fVar5) * fVar8;
        uVar87 = (uint)((int)fVar39 < (int)fVar86) * (int)fVar39 |
                 (uint)((int)fVar39 >= (int)fVar86) * (int)fVar86;
        uVar94 = (uint)((int)fVar56 < (int)fVar93) * (int)fVar56 |
                 (uint)((int)fVar56 >= (int)fVar93) * (int)fVar93;
        uVar98 = (uint)((int)fVar60 < (int)fVar97) * (int)fVar60 |
                 (uint)((int)fVar60 >= (int)fVar97) * (int)fVar97;
        uVar101 = (uint)((int)fVar63 < (int)fVar100) * (int)fVar63 |
                  (uint)((int)fVar63 >= (int)fVar100) * (int)fVar100;
        pfVar1 = (float *)(uVar38 + 0x20 + (uVar34 ^ 0x10));
        fVar39 = (*pfVar1 - fVar6) * fVar9;
        fVar56 = (pfVar1[1] - fVar6) * fVar9;
        fVar60 = (pfVar1[2] - fVar6) * fVar9;
        fVar63 = (pfVar1[3] - fVar6) * fVar9;
        uVar40 = (uint)(iVar68 < (int)fVar39) * iVar68 | (uint)(iVar68 >= (int)fVar39) * (int)fVar39
        ;
        uVar57 = (uint)(iVar79 < (int)fVar56) * iVar79 | (uint)(iVar79 >= (int)fVar56) * (int)fVar56
        ;
        uVar61 = (uint)(iVar82 < (int)fVar60) * iVar82 | (uint)(iVar82 >= (int)fVar60) * (int)fVar60
        ;
        uVar64 = (uint)(iVar85 < (int)fVar63) * iVar85 | (uint)(iVar85 >= (int)fVar63) * (int)fVar63
        ;
        auVar73._0_4_ =
             -(uint)((int)(((int)uVar87 < (int)uVar40) * uVar87 |
                          ((int)uVar87 >= (int)uVar40) * uVar40) < (int)local_10b8[0]);
        auVar73._4_4_ =
             -(uint)((int)(((int)uVar94 < (int)uVar57) * uVar94 |
                          ((int)uVar94 >= (int)uVar57) * uVar57) < (int)local_10b8[1]);
        auVar73._8_4_ =
             -(uint)((int)(((int)uVar98 < (int)uVar61) * uVar98 |
                          ((int)uVar98 >= (int)uVar61) * uVar61) < (int)local_10b8[2]);
        auVar73._12_4_ =
             -(uint)((int)(((int)uVar101 < (int)uVar64) * uVar101 |
                          ((int)uVar101 >= (int)uVar64) * uVar64) < (int)local_10b8[3]);
        iVar25 = movmskps((int)puVar28,auVar73);
        if (iVar25 == 0xf) {
          puVar28 = (undefined1 *)&local_f78;
          if (pauVar35 == (undefined1 (*) [16])puVar28) {
            return;
          }
          goto LAB_00269452;
        }
        bVar24 = (byte)iVar25 ^ 0xf;
        uVar36 = uVar38 & 0xfffffffffffffff0;
        puVar28 = (undefined1 *)0x0;
        if (bVar24 != 0) {
          for (; (bVar24 >> (long)puVar28 & 1) == 0;
              puVar28 = (undefined1 *)((long)*(undefined1 (*) [16])puVar28 + 1)) {
          }
        }
        uVar38 = *(ulong *)(uVar36 + (long)puVar28 * 8);
        uVar40 = bVar24 - 1 & (uint)bVar24;
        if (uVar40 != 0) {
          fVar39 = local_10b8[(long)puVar28];
          lVar37 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar29 = *(ulong *)(uVar36 + lVar37 * 8);
          fVar56 = local_10b8[lVar37];
          uVar40 = uVar40 - 1 & uVar40;
          if (uVar40 == 0) {
            puVar28 = (undefined1 *)(ulong)(uint)fVar56;
            if ((uint)fVar39 < (uint)fVar56) {
              *(ulong *)*pauVar35 = uVar29;
              *(float *)((long)*pauVar35 + 8) = fVar56;
              pauVar35 = pauVar35 + 1;
            }
            else {
              *(ulong *)*pauVar35 = uVar38;
              *(float *)((long)*pauVar35 + 8) = fVar39;
              pauVar35 = pauVar35 + 1;
              uVar38 = uVar29;
            }
          }
          else {
            auVar147._8_4_ = fVar39;
            auVar147._0_8_ = uVar38;
            auVar147._12_4_ = 0;
            auVar155._8_4_ = fVar56;
            auVar155._0_8_ = uVar29;
            auVar155._12_4_ = 0;
            lVar37 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar11 = *(undefined8 *)(uVar36 + lVar37 * 8);
            fVar60 = local_10b8[lVar37];
            auVar144._8_4_ = fVar60;
            auVar144._0_8_ = uVar11;
            auVar144._12_4_ = 0;
            auVar136._8_4_ = -(uint)((int)fVar39 < (int)fVar56);
            uVar40 = uVar40 - 1 & uVar40;
            if (uVar40 == 0) {
              auVar136._4_4_ = auVar136._8_4_;
              auVar136._0_4_ = auVar136._8_4_;
              auVar136._12_4_ = auVar136._8_4_;
              auVar134._8_4_ = fVar56;
              auVar134._0_8_ = uVar29;
              auVar134._12_4_ = 0;
              auVar135 = blendvps(auVar134,auVar147,auVar136);
              auVar73 = blendvps(auVar147,auVar155,auVar136);
              auVar42._8_4_ = -(uint)(auVar135._8_4_ < (int)fVar60);
              auVar42._4_4_ = auVar42._8_4_;
              auVar42._0_4_ = auVar42._8_4_;
              auVar42._12_4_ = auVar42._8_4_;
              auVar120._8_4_ = fVar60;
              auVar120._0_8_ = uVar11;
              auVar120._12_4_ = 0;
              auVar155 = blendvps(auVar120,auVar135,auVar42);
              auVar136 = blendvps(auVar135,auVar144,auVar42);
              auVar43._8_4_ = -(uint)(auVar73._8_4_ < auVar136._8_4_);
              auVar43._4_4_ = auVar43._8_4_;
              auVar43._0_4_ = auVar43._8_4_;
              auVar43._12_4_ = auVar43._8_4_;
              auVar147 = blendvps(auVar136,auVar73,auVar43);
              auVar73 = blendvps(auVar73,auVar136,auVar43);
              *pauVar35 = auVar73;
              pauVar35[1] = auVar147;
              uVar38 = auVar155._0_8_;
              pauVar35 = pauVar35 + 2;
              puVar28 = (undefined1 *)(ulong)uVar40;
            }
            else {
              puVar28 = (undefined1 *)0x0;
              if ((undefined1 (*) [16])(ulong)uVar40 != (undefined1 (*) [16])0x0) {
                for (; (uVar40 >> (long)puVar28 & 1) == 0;
                    puVar28 = (undefined1 *)((long)*(undefined1 (*) [16])puVar28 + 1)) {
                }
              }
              auVar135._4_4_ = auVar136._8_4_;
              auVar135._0_4_ = auVar136._8_4_;
              auVar135._8_4_ = auVar136._8_4_;
              auVar135._12_4_ = auVar136._8_4_;
              auVar136 = blendvps(auVar155,auVar147,auVar135);
              auVar73 = blendvps(auVar147,auVar155,auVar135);
              auVar143._8_4_ = local_10b8[(long)puVar28];
              auVar143._0_8_ = *(undefined8 *)(uVar36 + (long)puVar28 * 8);
              auVar143._12_4_ = 0;
              auVar44._8_4_ = -(uint)((int)fVar60 < (int)local_10b8[(long)puVar28]);
              auVar44._4_4_ = auVar44._8_4_;
              auVar44._0_4_ = auVar44._8_4_;
              auVar44._12_4_ = auVar44._8_4_;
              auVar155 = blendvps(auVar143,auVar144,auVar44);
              auVar147 = blendvps(auVar144,auVar143,auVar44);
              auVar45._8_4_ = -(uint)(auVar73._8_4_ < auVar147._8_4_);
              auVar45._4_4_ = auVar45._8_4_;
              auVar45._0_4_ = auVar45._8_4_;
              auVar45._12_4_ = auVar45._8_4_;
              auVar144 = blendvps(auVar147,auVar73,auVar45);
              auVar73 = blendvps(auVar73,auVar147,auVar45);
              auVar46._8_4_ = -(uint)(auVar136._8_4_ < auVar155._8_4_);
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              auVar147 = blendvps(auVar155,auVar136,auVar46);
              auVar136 = blendvps(auVar136,auVar155,auVar46);
              auVar47._8_4_ = -(uint)(auVar136._8_4_ < auVar144._8_4_);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              auVar155 = blendvps(auVar144,auVar136,auVar47);
              auVar136 = blendvps(auVar136,auVar144,auVar47);
              *pauVar35 = auVar73;
              pauVar35[1] = auVar136;
              pauVar35[2] = auVar155;
              uVar38 = auVar147._0_8_;
              pauVar35 = pauVar35 + 3;
            }
          }
        }
      }
      uVar36 = (ulong)((uint)uVar38 & 0xf);
      if (uVar36 != 8) {
        uVar38 = uVar38 & 0xfffffffffffffff0;
        local_10d8 = ZEXT416(*(uint *)(ray + k * 4));
        local_10c8 = ZEXT416(*(uint *)(ray + k * 4 + 0x10));
        fVar39 = *(float *)(ray + k * 4 + 0x20);
        fVar56 = *(float *)(ray + k * 4 + 0x40);
        fVar60 = *(float *)(ray + k * 4 + 0x50);
        fVar63 = *(float *)(ray + k * 4 + 0x60);
        lVar37 = 0;
        do {
          lVar32 = lVar37 * 0xe0;
          puVar2 = (undefined8 *)(uVar38 + 0xd0 + lVar32);
          local_fc8 = *puVar2;
          uStack_fc0 = puVar2[1];
          pfVar1 = (float *)(uVar38 + 0x10 + lVar32);
          fVar86 = *pfVar1;
          fVar93 = pfVar1[1];
          fVar97 = pfVar1[2];
          fVar100 = pfVar1[3];
          pfVar1 = (float *)(uVar38 + 0x20 + lVar32);
          fVar162 = *pfVar1;
          fVar164 = pfVar1[1];
          fVar166 = pfVar1[2];
          fVar168 = pfVar1[3];
          pfVar1 = (float *)(uVar38 + 0x40 + lVar32);
          local_1198 = *(undefined8 *)pfVar1;
          uStack_1190 = *(undefined8 *)(pfVar1 + 2);
          fVar66 = fVar86 - *pfVar1;
          fVar77 = fVar93 - pfVar1[1];
          fVar80 = fVar97 - pfVar1[2];
          fVar83 = fVar100 - pfVar1[3];
          pfVar1 = (float *)(uVar38 + 0x50 + lVar32);
          local_1158 = *(undefined8 *)pfVar1;
          uStack_1150 = *(undefined8 *)(pfVar1 + 2);
          fVar41 = fVar162 - *pfVar1;
          fVar58 = fVar164 - pfVar1[1];
          fVar62 = fVar166 - pfVar1[2];
          fVar65 = fVar168 - pfVar1[3];
          pauVar3 = (undefined1 (*) [16])(uVar38 + 0xa0 + lVar32);
          auVar73 = *pauVar3;
          fVar133 = *(float *)*pauVar3 - fVar86;
          fVar139 = *(float *)(*pauVar3 + 4) - fVar93;
          fVar140 = *(float *)(*pauVar3 + 8) - fVar97;
          fVar141 = *(float *)(*pauVar3 + 0xc) - fVar100;
          pfVar1 = (float *)(uVar38 + 0xb0 + lVar32);
          fVar119 = *pfVar1;
          fVar126 = pfVar1[1];
          fVar129 = pfVar1[2];
          fVar132 = pfVar1[3];
          fVar150 = fVar119 - fVar162;
          fVar156 = fVar126 - fVar164;
          fVar158 = fVar129 - fVar166;
          fVar160 = fVar132 - fVar168;
          fVar117 = fVar41 * fVar133 - fVar66 * fVar150;
          fVar124 = fVar58 * fVar139 - fVar77 * fVar156;
          fVar127 = fVar62 * fVar140 - fVar80 * fVar158;
          fVar130 = fVar65 * fVar141 - fVar83 * fVar160;
          pfVar1 = (float *)(uVar38 + lVar32);
          fVar151 = *pfVar1;
          fVar157 = pfVar1[1];
          fVar159 = pfVar1[2];
          fVar161 = pfVar1[3];
          pfVar1 = (float *)(uVar38 + 0x90 + lVar32);
          fVar104 = *pfVar1;
          fVar109 = pfVar1[1];
          fVar111 = pfVar1[2];
          fVar113 = pfVar1[3];
          fVar67 = fVar104 - fVar151;
          fVar78 = fVar109 - fVar157;
          fVar81 = fVar111 - fVar159;
          fVar84 = fVar113 - fVar161;
          fStack_f7c = local_10d8._0_4_;
          local_f88 = fVar151 - fStack_f7c;
          fStack_f84 = fVar157 - fStack_f7c;
          fStack_f80 = fVar159 - fStack_f7c;
          fStack_f7c = fVar161 - fStack_f7c;
          fVar163 = local_10c8._0_4_;
          fVar86 = fVar86 - fVar163;
          fVar93 = fVar93 - fVar163;
          fVar97 = fVar97 - fVar163;
          fVar100 = fVar100 - fVar163;
          fVar103 = local_f88 * fVar60 - fVar86 * fVar56;
          fVar108 = fStack_f84 * fVar60 - fVar93 * fVar56;
          fVar110 = fStack_f80 * fVar60 - fVar97 * fVar56;
          fVar112 = fStack_f7c * fVar60 - fVar100 * fVar56;
          pfVar1 = (float *)(uVar38 + 0x30 + lVar32);
          fVar163 = *pfVar1;
          fVar165 = pfVar1[1];
          fVar167 = pfVar1[2];
          fVar169 = pfVar1[3];
          fVar151 = fVar151 - fVar163;
          fVar157 = fVar157 - fVar165;
          fVar159 = fVar159 - fVar167;
          fVar161 = fVar161 - fVar169;
          fVar88 = fVar151 * fVar150 - fVar41 * fVar67;
          fVar95 = fVar157 * fVar156 - fVar58 * fVar78;
          uStack_1180._0_4_ = fVar159 * fVar158 - fVar62 * fVar81;
          uStack_1180._4_4_ = fVar161 * fVar160 - fVar65 * fVar84;
          local_1188 = CONCAT44(fVar95,fVar88);
          fVar162 = fVar162 - fVar39;
          fVar164 = fVar164 - fVar39;
          fVar166 = fVar166 - fVar39;
          fVar168 = fVar168 - fVar39;
          fVar89 = fVar162 * fVar56 - local_f88 * fVar63;
          fVar96 = fVar164 * fVar56 - fStack_f84 * fVar63;
          fVar99 = fVar166 * fVar56 - fStack_f80 * fVar63;
          fVar102 = fVar168 * fVar56 - fStack_f7c * fVar63;
          fVar39 = fVar66 * fVar67 - fVar151 * fVar133;
          fVar59 = fVar77 * fVar78 - fVar157 * fVar139;
          uStack_1130._0_4_ = fVar80 * fVar81 - fVar159 * fVar140;
          uStack_1130._4_4_ = fVar83 * fVar84 - fVar161 * fVar141;
          fVar118 = fVar86 * fVar63 - fVar162 * fVar60;
          fVar125 = fVar93 * fVar63 - fVar164 * fVar60;
          fVar128 = fVar97 * fVar63 - fVar166 * fVar60;
          fVar131 = fVar100 * fVar63 - fVar168 * fVar60;
          local_1138 = CONCAT44(fVar59,fVar39);
          fVar142 = fVar56 * fVar117 + fVar60 * fVar88 + fVar63 * fVar39;
          fVar148 = fVar56 * fVar124 + fVar60 * fVar95 + fVar63 * fVar59;
          fVar149 = fVar56 * fVar127 + fVar60 * (float)uStack_1180 + fVar63 * (float)uStack_1130;
          fVar63 = fVar56 * fVar130 + fVar60 * uStack_1180._4_4_ + fVar63 * uStack_1130._4_4_;
          uVar57 = (uint)fVar142 & 0x80000000;
          uVar61 = (uint)fVar148 & 0x80000000;
          uVar64 = (uint)fVar149 & 0x80000000;
          uVar87 = (uint)fVar63 & 0x80000000;
          local_10b8[0] =
               (float)((uint)(fVar67 * fVar118 + fVar133 * fVar89 + fVar150 * fVar103) ^ uVar57);
          local_10b8[1] =
               (float)((uint)(fVar78 * fVar125 + fVar139 * fVar96 + fVar156 * fVar108) ^ uVar61);
          local_10b8[2] =
               (float)((uint)(fVar81 * fVar128 + fVar140 * fVar99 + fVar158 * fVar110) ^ uVar64);
          local_10b8[3] =
               (float)((uint)(fVar84 * fVar131 + fVar141 * fVar102 + fVar160 * fVar112) ^ uVar87);
          local_10a8._0_4_ = (uint)(fVar118 * fVar151 + fVar89 * fVar66 + fVar103 * fVar41) ^ uVar57
          ;
          local_10a8._4_4_ = (uint)(fVar125 * fVar157 + fVar96 * fVar77 + fVar108 * fVar58) ^ uVar61
          ;
          fStack_10a0 = (float)((uint)(fVar128 * fVar159 + fVar99 * fVar80 + fVar110 * fVar62) ^
                               uVar64);
          fStack_109c = (float)((uint)(fVar131 * fVar161 + fVar102 * fVar83 + fVar112 * fVar65) ^
                               uVar87);
          fVar56 = ABS(fVar142);
          fVar60 = ABS(fVar148);
          local_1088 = (undefined1  [8])(CONCAT44(fVar148,fVar142) & 0x7fffffff7fffffff);
          fStack_1080 = ABS(fVar149);
          fStack_107c = ABS(fVar63);
          bVar22 = ((0.0 <= local_10b8[0] && 0.0 <= (float)local_10a8._0_4_) && fVar142 != 0.0) &&
                   local_10b8[0] + (float)local_10a8._0_4_ <= fVar56;
          auVar152._0_4_ = -(uint)bVar22;
          bVar23 = ((0.0 <= local_10b8[1] && 0.0 <= (float)local_10a8._4_4_) && fVar148 != 0.0) &&
                   local_10b8[1] + (float)local_10a8._4_4_ <= fVar60;
          auVar152._4_4_ = -(uint)bVar23;
          bVar21 = ((0.0 <= local_10b8[2] && 0.0 <= fStack_10a0) && fVar149 != 0.0) &&
                   local_10b8[2] + fStack_10a0 <= fStack_1080;
          auVar152._8_4_ = -(uint)bVar21;
          bVar20 = ((0.0 <= local_10b8[3] && 0.0 <= fStack_109c) && fVar63 != 0.0) &&
                   local_10b8[3] + fStack_109c <= fStack_107c;
          auVar152._12_4_ = -(uint)bVar20;
          lVar32 = lVar32 + uVar38;
          uVar40 = movmskps((int)puVar28,auVar152);
          uVar30 = (undefined4)((ulong)context >> 0x20);
          if (uVar40 == 0) {
LAB_002699c9:
            local_1118 = auVar73._0_4_;
            fStack_1114 = auVar73._4_4_;
            fStack_1110 = auVar73._8_4_;
            fStack_110c = auVar73._12_4_;
          }
          else {
            local_1098 = (float)(uVar57 ^ (uint)(local_f88 * fVar117 +
                                                fVar86 * fVar88 + fVar162 * fVar39));
            fStack_1094 = (float)(uVar61 ^ (uint)(fStack_f84 * fVar124 +
                                                 fVar93 * fVar95 + fVar164 * fVar59));
            fStack_1090 = (float)(uVar64 ^ (uint)(fStack_f80 * fVar127 +
                                                 fVar97 * (float)uStack_1180 +
                                                 fVar166 * (float)uStack_1130));
            fStack_108c = (float)(uVar87 ^ (uint)(fStack_f7c * fVar130 +
                                                 fVar100 * uStack_1180._4_4_ +
                                                 fVar168 * uStack_1130._4_4_));
            fVar39 = *(float *)(ray + k * 4 + 0x30);
            fVar63 = *(float *)(ray + k * 4 + 0x80);
            bVar13 = fVar39 * fVar56 < local_1098;
            bVar14 = fVar39 * fVar60 < fStack_1094;
            bVar15 = fVar39 * fStack_1080 < fStack_1090;
            bVar16 = fVar39 * fStack_107c < fStack_108c;
            auVar90._4_4_ = -(uint)bVar14;
            auVar90._0_4_ = -(uint)bVar13;
            auVar90._8_4_ = -(uint)bVar15;
            auVar90._12_4_ = -(uint)bVar16;
            bVar22 = (local_1098 <= fVar63 * fVar56 && bVar13) && bVar22;
            bVar23 = (fStack_1094 <= fVar63 * fVar60 && bVar14) && bVar23;
            local_10e8._0_8_ = CONCAT44(-(uint)bVar23,-(uint)bVar22);
            bVar21 = (fStack_1090 <= fVar63 * fStack_1080 && bVar15) && bVar21;
            local_10e8._8_4_ = -(uint)bVar21;
            bVar20 = (fStack_108c <= fVar63 * fStack_107c && bVar16) && bVar20;
            local_10e8._12_4_ = -(uint)bVar20;
            uVar40 = movmskps(uVar40,local_10e8);
            if (uVar40 == 0) goto LAB_002699c9;
            local_1078 = CONCAT44(fVar124,fVar117);
            uStack_1070 = CONCAT44(fVar130,fVar127);
            local_1068 = local_1188;
            uStack_1060 = CONCAT44(uStack_1180._4_4_,(float)uStack_1180);
            local_1058 = local_1138;
            uStack_1050 = uStack_1130;
            local_1048 = local_10e8;
            local_fd8._8_8_ = uStack_fa0;
            local_fd8._0_8_ = local_fa8;
            auVar147 = rcpps(auVar90,_local_1088);
            fVar39 = auVar147._0_4_;
            fVar63 = auVar147._4_4_;
            fVar86 = auVar147._8_4_;
            fVar93 = auVar147._12_4_;
            fVar100 = (float)DAT_01f7ba10;
            fVar162 = DAT_01f7ba10._4_4_;
            fVar164 = DAT_01f7ba10._12_4_;
            fVar97 = DAT_01f7ba10._8_4_;
            fVar39 = (fVar100 - fVar56 * fVar39) * fVar39 + fVar39;
            fVar63 = (fVar162 - fVar60 * fVar63) * fVar63 + fVar63;
            fVar86 = (fVar97 - fStack_1080 * fVar86) * fVar86 + fVar86;
            fVar93 = (fVar164 - fStack_107c * fVar93) * fVar93 + fVar93;
            auVar105._0_4_ = local_1098 * fVar39;
            auVar105._4_4_ = fStack_1094 * fVar63;
            auVar105._8_4_ = fStack_1090 * fVar86;
            auVar105._12_4_ = fStack_108c * fVar93;
            _local_1018 = auVar105;
            auVar137._0_4_ = local_10b8[0] * fVar39;
            auVar137._4_4_ = local_10b8[1] * fVar63;
            auVar137._8_4_ = local_10b8[2] * fVar86;
            auVar137._12_4_ = local_10b8[3] * fVar93;
            auVar147 = minps(auVar137,_DAT_01f7ba10);
            auVar154._0_4_ = fVar39 * (float)local_10a8._0_4_;
            auVar154._4_4_ = fVar63 * (float)local_10a8._4_4_;
            auVar154._8_4_ = fVar86 * fStack_10a0;
            auVar154._12_4_ = fVar93 * fStack_109c;
            auVar155 = minps(auVar154,_DAT_01f7ba10);
            auVar69._0_4_ = fVar100 - auVar147._0_4_;
            auVar69._4_4_ = fVar162 - auVar147._4_4_;
            auVar69._8_4_ = fVar97 - auVar147._8_4_;
            auVar69._12_4_ = fVar164 - auVar147._12_4_;
            auVar91._0_4_ = fVar100 - auVar155._0_4_;
            auVar91._4_4_ = fVar162 - auVar155._4_4_;
            auVar91._8_4_ = fVar97 - auVar155._8_4_;
            auVar91._12_4_ = fVar164 - auVar155._12_4_;
            local_1038 = blendvps(auVar147,auVar69,local_fd8);
            local_1028 = blendvps(auVar155,auVar91,local_fd8);
            local_1008 = CONCAT44(fVar124,fVar117);
            uStack_1000 = CONCAT44(fVar130,fVar127);
            local_ff8 = local_1188;
            uStack_ff0 = uStack_1180;
            local_fe8 = local_1138;
            uStack_fe0 = uStack_1130;
            auVar48._8_4_ = local_10e8._8_4_;
            auVar48._0_8_ = local_10e8._0_8_;
            auVar48._12_4_ = local_10e8._12_4_;
            auVar155 = blendvps(_DAT_01f7a9f0,auVar105,auVar48);
            auVar92._4_4_ = auVar155._0_4_;
            auVar92._0_4_ = auVar155._4_4_;
            auVar92._8_4_ = auVar155._12_4_;
            auVar92._12_4_ = auVar155._8_4_;
            auVar147 = minps(auVar92,auVar155);
            auVar49._0_8_ = auVar147._8_8_;
            auVar49._8_4_ = auVar147._0_4_;
            auVar49._12_4_ = auVar147._4_4_;
            auVar147 = minps(auVar49,auVar147);
            auVar50._0_8_ =
                 CONCAT44(-(uint)(auVar147._4_4_ == auVar155._4_4_ && bVar23),
                          -(uint)(auVar147._0_4_ == auVar155._0_4_ && bVar22));
            auVar50._8_4_ = -(uint)(auVar147._8_4_ == auVar155._8_4_ && bVar21);
            auVar50._12_4_ = -(uint)(auVar147._12_4_ == auVar155._12_4_ && bVar20);
            iVar26 = movmskps((int)context,auVar50);
            auVar145 = local_10e8;
            if (iVar26 != 0) {
              auVar145._8_4_ = auVar50._8_4_;
              auVar145._0_8_ = auVar50._0_8_;
              auVar145._12_4_ = auVar50._12_4_;
            }
            uVar27 = movmskps(iVar26,auVar145);
            uVar29 = CONCAT44(uVar30,uVar27);
            local_11b8 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> local_11b8 & 1) == 0; local_11b8 = local_11b8 + 1) {
              }
            }
            pRVar12 = (context->scene->geometries).items;
            uVar57 = *(uint *)(ray + k * 4 + 0x90);
            uVar40 = *(uint *)(lVar32 + 0xc0 + local_11b8 * 4);
            while (((pRVar12[uVar40].ptr)->mask & uVar57) == 0) {
              *(undefined4 *)(local_10e8 + local_11b8 * 4) = 0;
              uVar40 = movmskps((int)local_11b8,local_10e8);
              if (uVar40 == 0) goto LAB_002699c9;
              auVar155 = blendvps(_DAT_01f7a9f0,auVar105,local_10e8);
              auVar121._4_4_ = auVar155._0_4_;
              auVar121._0_4_ = auVar155._4_4_;
              auVar121._8_4_ = auVar155._12_4_;
              auVar121._12_4_ = auVar155._8_4_;
              auVar147 = minps(auVar121,auVar155);
              auVar70._0_8_ = auVar147._8_8_;
              auVar70._8_4_ = auVar147._0_4_;
              auVar70._12_4_ = auVar147._4_4_;
              auVar147 = minps(auVar70,auVar147);
              auVar71._0_8_ =
                   CONCAT44(-(uint)(auVar147._4_4_ == auVar155._4_4_) & local_10e8._4_4_,
                            -(uint)(auVar147._0_4_ == auVar155._0_4_) & local_10e8._0_4_);
              auVar71._8_4_ = -(uint)(auVar147._8_4_ == auVar155._8_4_) & local_10e8._8_4_;
              auVar71._12_4_ = -(uint)(auVar147._12_4_ == auVar155._12_4_) & local_10e8._12_4_;
              iVar26 = movmskps(uVar40,auVar71);
              auVar51 = local_10e8;
              if (iVar26 != 0) {
                auVar51._8_4_ = auVar71._8_4_;
                auVar51._0_8_ = auVar71._0_8_;
                auVar51._12_4_ = auVar71._12_4_;
              }
              uVar27 = movmskps(iVar26,auVar51);
              uVar29 = CONCAT44((int)((ulong)local_11b8 >> 0x20),uVar27);
              local_11b8 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> local_11b8 & 1) == 0; local_11b8 = local_11b8 + 1) {
                }
              }
              uVar40 = *(uint *)(lVar32 + 0xc0 + local_11b8 * 4);
            }
            uVar27 = *(undefined4 *)(local_1038 + local_11b8 * 4);
            uVar10 = *(undefined4 *)(local_1028 + local_11b8 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1018 + local_11b8 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) =
                 *(undefined4 *)((long)&local_1008 + local_11b8 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_ff8 + local_11b8 * 4)
            ;
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_fe8 + local_11b8 * 4)
            ;
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar27;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar10;
            *(undefined4 *)(ray + k * 4 + 0x110) =
                 *(undefined4 *)((long)&local_fc8 + local_11b8 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar40;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar40 = context->user->instPrimID[0];
            *(uint *)(ray + k * 4 + 0x140) = uVar40;
            fVar163 = *(float *)(lVar32 + 0x30);
            fVar165 = *(float *)(lVar32 + 0x34);
            fVar167 = *(float *)(lVar32 + 0x38);
            fVar169 = *(float *)(lVar32 + 0x3c);
            local_1198 = *(undefined8 *)(lVar32 + 0x40);
            uStack_1190 = *(undefined8 *)(lVar32 + 0x48);
            local_1158 = *(undefined8 *)(lVar32 + 0x50);
            uStack_1150 = *(undefined8 *)(lVar32 + 0x58);
            fVar104 = *(float *)(lVar32 + 0x90);
            fVar109 = *(float *)(lVar32 + 0x94);
            fVar111 = *(float *)(lVar32 + 0x98);
            fVar113 = *(float *)(lVar32 + 0x9c);
            local_1118 = *(float *)(lVar32 + 0xa0);
            fStack_1114 = *(float *)(lVar32 + 0xa4);
            fStack_1110 = *(float *)(lVar32 + 0xa8);
            fStack_110c = *(float *)(lVar32 + 0xac);
            fVar119 = *(float *)(lVar32 + 0xb0);
            fVar126 = *(float *)(lVar32 + 0xb4);
            fVar129 = *(float *)(lVar32 + 0xb8);
            fVar132 = *(float *)(lVar32 + 0xbc);
          }
          fVar86 = *(float *)(lVar32 + 0x60);
          fVar93 = *(float *)(lVar32 + 100);
          fVar97 = *(float *)(lVar32 + 0x68);
          fVar100 = *(float *)(lVar32 + 0x6c);
          fVar162 = *(float *)(lVar32 + 0x70);
          fVar164 = *(float *)(lVar32 + 0x74);
          fVar166 = *(float *)(lVar32 + 0x78);
          fVar168 = *(float *)(lVar32 + 0x7c);
          fVar151 = *(float *)(lVar32 + 0x80);
          fVar157 = *(float *)(lVar32 + 0x84);
          fVar159 = *(float *)(lVar32 + 0x88);
          fVar161 = *(float *)(lVar32 + 0x8c);
          fVar104 = fVar86 - fVar104;
          fVar109 = fVar93 - fVar109;
          fVar111 = fVar97 - fVar111;
          fVar113 = fVar100 - fVar113;
          local_1118 = fVar162 - local_1118;
          fStack_1114 = fVar164 - fStack_1114;
          fStack_1110 = fVar166 - fStack_1110;
          fStack_110c = fVar168 - fStack_110c;
          fVar119 = fVar151 - fVar119;
          fVar126 = fVar157 - fVar126;
          fVar129 = fVar159 - fVar129;
          fVar132 = fVar161 - fVar132;
          fVar163 = fVar163 - fVar86;
          fVar165 = fVar165 - fVar93;
          fVar167 = fVar167 - fVar97;
          fVar169 = fVar169 - fVar100;
          fVar78 = (float)local_1198 - fVar162;
          fVar81 = local_1198._4_4_ - fVar164;
          fVar84 = (float)uStack_1190 - fVar166;
          fVar89 = uStack_1190._4_4_ - fVar168;
          local_1158._0_4_ = (float)local_1158 - fVar151;
          local_1158._4_4_ = local_1158._4_4_ - fVar157;
          uStack_1150._0_4_ = (float)uStack_1150 - fVar159;
          uStack_1150._4_4_ = uStack_1150._4_4_ - fVar161;
          fVar65 = fVar119 * fVar78 - local_1118 * (float)local_1158;
          fVar66 = fVar126 * fVar81 - fStack_1114 * local_1158._4_4_;
          fVar67 = fVar129 * fVar84 - fStack_1110 * (float)uStack_1150;
          fVar77 = fVar132 * fVar89 - fStack_110c * uStack_1150._4_4_;
          fVar39 = *(float *)(ray + k * 4);
          local_10d8 = ZEXT416((uint)fVar39);
          fVar63 = *(float *)(ray + k * 4 + 0x10);
          local_10c8 = ZEXT416((uint)fVar63);
          fVar56 = *(float *)(ray + k * 4 + 0x40);
          fVar60 = *(float *)(ray + k * 4 + 0x50);
          fVar86 = fVar86 - fVar39;
          fVar93 = fVar93 - fVar39;
          fVar97 = fVar97 - fVar39;
          fVar100 = fVar100 - fVar39;
          fVar162 = fVar162 - fVar63;
          fVar164 = fVar164 - fVar63;
          fVar166 = fVar166 - fVar63;
          fVar168 = fVar168 - fVar63;
          fVar80 = fVar86 * fVar60 - fVar162 * fVar56;
          fVar83 = fVar93 * fVar60 - fVar164 * fVar56;
          fVar88 = fVar97 * fVar60 - fVar166 * fVar56;
          fVar95 = fVar100 * fVar60 - fVar168 * fVar56;
          fVar41 = fVar104 * (float)local_1158 - fVar119 * fVar163;
          fVar58 = fVar109 * local_1158._4_4_ - fVar126 * fVar165;
          fVar59 = fVar111 * (float)uStack_1150 - fVar129 * fVar167;
          fVar62 = fVar113 * uStack_1150._4_4_ - fVar132 * fVar169;
          local_11a8 = CONCAT44(fVar58,fVar41);
          fVar39 = *(float *)(ray + k * 4 + 0x20);
          fVar151 = fVar151 - fVar39;
          fVar157 = fVar157 - fVar39;
          fVar159 = fVar159 - fVar39;
          fVar161 = fVar161 - fVar39;
          fVar63 = *(float *)(ray + k * 4 + 0x60);
          fVar118 = fVar151 * fVar56 - fVar86 * fVar63;
          fVar124 = fVar157 * fVar56 - fVar93 * fVar63;
          fVar125 = fVar159 * fVar56 - fVar97 * fVar63;
          fVar127 = fVar161 * fVar56 - fVar100 * fVar63;
          fVar96 = local_1118 * fVar163 - fVar104 * fVar78;
          fVar99 = fStack_1114 * fVar165 - fVar109 * fVar81;
          fVar102 = fStack_1110 * fVar167 - fVar111 * fVar84;
          fVar103 = fStack_110c * fVar169 - fVar113 * fVar89;
          fVar108 = fVar162 * fVar63 - fVar151 * fVar60;
          fVar110 = fVar164 * fVar63 - fVar157 * fVar60;
          fVar112 = fVar166 * fVar63 - fVar159 * fVar60;
          fVar117 = fVar168 * fVar63 - fVar161 * fVar60;
          local_1198 = CONCAT44(fVar99,fVar96);
          uStack_1190 = CONCAT44(fVar103,fVar102);
          fVar128 = fVar56 * fVar65 + fVar60 * fVar41 + fVar63 * fVar96;
          fVar130 = fVar56 * fVar66 + fVar60 * fVar58 + fVar63 * fVar99;
          fVar131 = fVar56 * fVar67 + fVar60 * fVar59 + fVar63 * fVar102;
          fVar133 = fVar56 * fVar77 + fVar60 * fVar62 + fVar63 * fVar103;
          uVar57 = (uint)fVar128 & 0x80000000;
          uVar61 = (uint)fVar130 & 0x80000000;
          uVar64 = (uint)fVar131 & 0x80000000;
          uVar87 = (uint)fVar133 & 0x80000000;
          local_10b8[0] =
               (float)((uint)(fVar163 * fVar108 + fVar78 * fVar118 + (float)local_1158 * fVar80) ^
                      uVar57);
          local_10b8[1] =
               (float)((uint)(fVar165 * fVar110 + fVar81 * fVar124 + local_1158._4_4_ * fVar83) ^
                      uVar61);
          local_10b8[2] =
               (float)((uint)(fVar167 * fVar112 + fVar84 * fVar125 + (float)uStack_1150 * fVar88) ^
                      uVar64);
          local_10b8[3] =
               (float)((uint)(fVar169 * fVar117 + fVar89 * fVar127 + uStack_1150._4_4_ * fVar95) ^
                      uVar87);
          local_10a8._0_4_ =
               (uint)(fVar108 * fVar104 + fVar118 * local_1118 + fVar80 * fVar119) ^ uVar57;
          local_10a8._4_4_ =
               (uint)(fVar110 * fVar109 + fVar124 * fStack_1114 + fVar83 * fVar126) ^ uVar61;
          fStack_10a0 = (float)((uint)(fVar112 * fVar111 + fVar125 * fStack_1110 + fVar88 * fVar129)
                               ^ uVar64);
          fStack_109c = (float)((uint)(fVar117 * fVar113 + fVar127 * fStack_110c + fVar95 * fVar132)
                               ^ uVar87);
          local_1088._0_4_ = ABS(fVar128);
          local_1088._4_4_ = ABS(fVar130);
          fStack_1080 = ABS(fVar131);
          fStack_107c = ABS(fVar133);
          bVar22 = ((0.0 <= (float)local_10a8._0_4_ && 0.0 <= local_10b8[0]) && fVar128 != 0.0) &&
                   local_10b8[0] + (float)local_10a8._0_4_ <= (float)local_1088._0_4_;
          auVar153._0_4_ = -(uint)bVar22;
          bVar23 = ((0.0 <= (float)local_10a8._4_4_ && 0.0 <= local_10b8[1]) && fVar130 != 0.0) &&
                   local_10b8[1] + (float)local_10a8._4_4_ <= (float)local_1088._4_4_;
          auVar153._4_4_ = -(uint)bVar23;
          bVar21 = ((0.0 <= fStack_10a0 && 0.0 <= local_10b8[2]) && fVar131 != 0.0) &&
                   local_10b8[2] + fStack_10a0 <= fStack_1080;
          auVar153._8_4_ = -(uint)bVar21;
          bVar20 = ((0.0 <= fStack_109c && 0.0 <= local_10b8[3]) && fVar133 != 0.0) &&
                   local_10b8[3] + fStack_109c <= fStack_107c;
          auVar153._12_4_ = -(uint)bVar20;
          uVar40 = movmskps(uVar40,auVar153);
          puVar28 = (undefined1 *)(ulong)uVar40;
          if (uVar40 != 0) {
            local_1098 = (float)(uVar57 ^ (uint)(fVar86 * fVar65 +
                                                fVar162 * fVar41 + fVar151 * fVar96));
            fStack_1094 = (float)(uVar61 ^ (uint)(fVar93 * fVar66 +
                                                 fVar164 * fVar58 + fVar157 * fVar99));
            fStack_1090 = (float)(uVar64 ^ (uint)(fVar97 * fVar67 +
                                                 fVar166 * fVar59 + fVar159 * fVar102));
            fStack_108c = (float)(uVar87 ^ (uint)(fVar100 * fVar77 +
                                                 fVar168 * fVar62 + fVar161 * fVar103));
            fVar86 = *(float *)(ray + k * 4 + 0x30);
            fVar93 = *(float *)(ray + k * 4 + 0x80);
            bVar13 = fVar86 * (float)local_1088._0_4_ < local_1098;
            bVar14 = fVar86 * (float)local_1088._4_4_ < fStack_1094;
            bVar15 = fVar86 * fStack_1080 < fStack_1090;
            bVar16 = fVar86 * fStack_107c < fStack_108c;
            auVar72._4_4_ = -(uint)bVar14;
            auVar72._0_4_ = -(uint)bVar13;
            auVar72._8_4_ = -(uint)bVar15;
            auVar72._12_4_ = -(uint)bVar16;
            bVar22 = (local_1098 <= fVar93 * (float)local_1088._0_4_ && bVar13) && bVar22;
            bVar23 = (fStack_1094 <= fVar93 * (float)local_1088._4_4_ && bVar14) && bVar23;
            local_10e8._0_8_ = CONCAT44(-(uint)bVar23,-(uint)bVar22);
            bVar21 = (fStack_1090 <= fVar93 * fStack_1080 && bVar15) && bVar21;
            local_10e8._8_4_ = -(uint)bVar21;
            bVar20 = (fStack_108c <= fVar93 * fStack_107c && bVar16) && bVar20;
            local_10e8._12_4_ = -(uint)bVar20;
            uVar40 = movmskps(uVar40,local_10e8);
            puVar28 = (undefined1 *)(ulong)uVar40;
            if (uVar40 != 0) {
              local_1078 = CONCAT44(fVar66,fVar65);
              uStack_1070 = CONCAT44(fVar77,fVar67);
              local_1068 = local_11a8;
              uStack_1060 = CONCAT44(fVar62,fVar59);
              local_1058 = local_1198;
              uStack_1050 = uStack_1190;
              local_1048 = local_10e8;
              local_fd8._8_8_ = uStack_fb0;
              local_fd8._0_8_ = local_fb8;
              auVar19._4_4_ = local_1088._4_4_;
              auVar19._0_4_ = local_1088._0_4_;
              auVar19._8_4_ = fStack_1080;
              auVar19._12_4_ = fStack_107c;
              auVar73 = rcpps(auVar72,auVar19);
              fVar86 = auVar73._0_4_;
              fVar93 = auVar73._4_4_;
              fVar97 = auVar73._8_4_;
              fVar100 = auVar73._12_4_;
              fVar126 = (float)DAT_01f7ba10;
              fVar129 = DAT_01f7ba10._4_4_;
              fVar132 = DAT_01f7ba10._12_4_;
              fVar119 = DAT_01f7ba10._8_4_;
              fVar86 = (fVar126 - (float)local_1088._0_4_ * fVar86) * fVar86 + fVar86;
              fVar93 = (fVar129 - (float)local_1088._4_4_ * fVar93) * fVar93 + fVar93;
              fVar97 = (fVar119 - fStack_1080 * fVar97) * fVar97 + fVar97;
              fVar100 = (fVar132 - fStack_107c * fVar100) * fVar100 + fVar100;
              fVar162 = local_1098 * fVar86;
              fVar164 = fStack_1094 * fVar93;
              fVar166 = fStack_1090 * fVar97;
              fVar168 = fStack_108c * fVar100;
              local_1018._4_4_ = fVar164;
              local_1018._0_4_ = fVar162;
              fStack_1010 = fVar166;
              fStack_100c = fVar168;
              auVar106._0_4_ = local_10b8[0] * fVar86;
              auVar106._4_4_ = local_10b8[1] * fVar93;
              auVar106._8_4_ = local_10b8[2] * fVar97;
              auVar106._12_4_ = local_10b8[3] * fVar100;
              auVar73 = minps(auVar106,_DAT_01f7ba10);
              auVar146._0_4_ = fVar86 * (float)local_10a8._0_4_;
              auVar146._4_4_ = fVar93 * (float)local_10a8._4_4_;
              auVar146._8_4_ = fVar97 * fStack_10a0;
              auVar146._12_4_ = fVar100 * fStack_109c;
              auVar147 = minps(auVar146,_DAT_01f7ba10);
              auVar74._0_4_ = fVar126 - auVar73._0_4_;
              auVar74._4_4_ = fVar129 - auVar73._4_4_;
              auVar74._8_4_ = fVar119 - auVar73._8_4_;
              auVar74._12_4_ = fVar132 - auVar73._12_4_;
              auVar122._0_4_ = fVar126 - auVar147._0_4_;
              auVar122._4_4_ = fVar129 - auVar147._4_4_;
              auVar122._8_4_ = fVar119 - auVar147._8_4_;
              auVar122._12_4_ = fVar132 - auVar147._12_4_;
              local_1038 = blendvps(auVar73,auVar74,local_fd8);
              local_1028 = blendvps(auVar147,auVar122,local_fd8);
              local_1008 = CONCAT44(fVar66,fVar65);
              uStack_1000 = CONCAT44(fVar77,fVar67);
              local_ff8 = local_11a8;
              uStack_ff0 = CONCAT44(fVar62,fVar59);
              local_fe8 = local_1198;
              uStack_fe0 = uStack_1190;
              auVar52._8_4_ = local_10e8._8_4_;
              auVar52._0_8_ = local_10e8._0_8_;
              auVar52._12_4_ = local_10e8._12_4_;
              auVar17._4_4_ = fVar164;
              auVar17._0_4_ = fVar162;
              auVar17._8_4_ = fVar166;
              auVar17._12_4_ = fVar168;
              auVar147 = blendvps(_DAT_01f7a9f0,auVar17,auVar52);
              auVar107._4_4_ = auVar147._0_4_;
              auVar107._0_4_ = auVar147._4_4_;
              auVar107._8_4_ = auVar147._12_4_;
              auVar107._12_4_ = auVar147._8_4_;
              auVar73 = minps(auVar107,auVar147);
              auVar53._0_8_ = auVar73._8_8_;
              auVar53._8_4_ = auVar73._0_4_;
              auVar53._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar53,auVar73);
              auVar54._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar147._4_4_ && bVar23),
                            -(uint)(auVar73._0_4_ == auVar147._0_4_ && bVar22));
              auVar54._8_4_ = -(uint)(auVar73._8_4_ == auVar147._8_4_ && bVar21);
              auVar54._12_4_ = -(uint)(auVar73._12_4_ == auVar147._12_4_ && bVar20);
              iVar26 = movmskps((int)context,auVar54);
              auVar138 = local_10e8;
              if (iVar26 != 0) {
                auVar138._8_4_ = auVar54._8_4_;
                auVar138._0_8_ = auVar54._0_8_;
                auVar138._12_4_ = auVar54._12_4_;
              }
              uVar27 = movmskps(iVar26,auVar138);
              uVar29 = CONCAT44(uVar30,uVar27);
              local_11b8 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> local_11b8 & 1) == 0; local_11b8 = local_11b8 + 1) {
                }
              }
              pRVar12 = (context->scene->geometries).items;
              uVar40 = *(uint *)(ray + k * 4 + 0x90);
              uVar57 = *(uint *)(lVar32 + 0xc0 + local_11b8 * 4);
              while (((pRVar12[uVar57].ptr)->mask & uVar40) == 0) {
                *(undefined4 *)(local_10e8 + local_11b8 * 4) = 0;
                uVar30 = (undefined4)((ulong)local_11b8 >> 0x20);
                iVar26 = movmskps((int)local_11b8,local_10e8);
                puVar28 = (undefined1 *)CONCAT44(uVar30,iVar26);
                if (iVar26 == 0) goto LAB_00269bee;
                auVar18._4_4_ = fVar164;
                auVar18._0_4_ = fVar162;
                auVar18._8_4_ = fVar166;
                auVar18._12_4_ = fVar168;
                auVar147 = blendvps(_DAT_01f7a9f0,auVar18,local_10e8);
                auVar123._4_4_ = auVar147._0_4_;
                auVar123._0_4_ = auVar147._4_4_;
                auVar123._8_4_ = auVar147._12_4_;
                auVar123._12_4_ = auVar147._8_4_;
                auVar73 = minps(auVar123,auVar147);
                auVar75._0_8_ = auVar73._8_8_;
                auVar75._8_4_ = auVar73._0_4_;
                auVar75._12_4_ = auVar73._4_4_;
                auVar73 = minps(auVar75,auVar73);
                auVar76._0_8_ =
                     CONCAT44(-(uint)(auVar73._4_4_ == auVar147._4_4_) & local_10e8._4_4_,
                              -(uint)(auVar73._0_4_ == auVar147._0_4_) & local_10e8._0_4_);
                auVar76._8_4_ = -(uint)(auVar73._8_4_ == auVar147._8_4_) & local_10e8._8_4_;
                auVar76._12_4_ = -(uint)(auVar73._12_4_ == auVar147._12_4_) & local_10e8._12_4_;
                iVar26 = movmskps(iVar26,auVar76);
                auVar55 = local_10e8;
                if (iVar26 != 0) {
                  auVar55._8_4_ = auVar76._8_4_;
                  auVar55._0_8_ = auVar76._0_8_;
                  auVar55._12_4_ = auVar76._12_4_;
                }
                uVar27 = movmskps(iVar26,auVar55);
                uVar29 = CONCAT44(uVar30,uVar27);
                local_11b8 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> local_11b8 & 1) == 0; local_11b8 = local_11b8 + 1) {
                  }
                }
                uVar57 = *(uint *)(lVar32 + 0xc0 + local_11b8 * 4);
              }
              uVar30 = *(undefined4 *)(local_1038 + local_11b8 * 4);
              uVar27 = *(undefined4 *)(local_1028 + local_11b8 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1018 + local_11b8 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) =
                   *(undefined4 *)((long)&local_1008 + local_11b8 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) =
                   *(undefined4 *)((long)&local_ff8 + local_11b8 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) =
                   *(undefined4 *)((long)&local_fe8 + local_11b8 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar27;
              *(undefined4 *)(ray + k * 4 + 0x110) =
                   *(undefined4 *)((long)&local_fc8 + local_11b8 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar57;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar40 = context->user->instPrimID[0];
              puVar28 = (undefined1 *)(ulong)uVar40;
              *(uint *)(ray + k * 4 + 0x140) = uVar40;
            }
          }
LAB_00269bee:
          lVar37 = lVar37 + 1;
        } while (lVar37 != uVar36 - 8);
      }
      iVar68 = *(int *)(ray + k * 4 + 0x80);
      iVar114 = local_f98;
      iVar115 = iStack_f94;
      iVar116 = iStack_f90;
      iVar26 = iStack_f8c;
      iVar79 = iVar68;
      iVar82 = iVar68;
      iVar85 = iVar68;
    }
    puVar28 = (undefined1 *)&local_f78;
    if (pauVar35 == (undefined1 (*) [16])puVar28) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }